

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

Node * makeRule(char *name,int defined)

{
  Node *pNVar1;
  char *pcVar2;
  
  pNVar1 = (Node *)calloc(1,0x38);
  pNVar1->type = 1;
  (pNVar1->rule).errblock = (char *)0x0;
  pcVar2 = strdup(name);
  (pNVar1->rule).name = pcVar2;
  ruleCount = ruleCount + 1;
  (pNVar1->rule).id = ruleCount;
  (pNVar1->rule).flags = (uint)(defined != 0);
  (pNVar1->rule).next = rules;
  rules = pNVar1;
  return pNVar1;
}

Assistant:

Node *makeRule(char *name, int defined)
{
  Node *node= newNode(Rule);
  node->rule.name= strdup(name);
  node->rule.id= ++ruleCount;
  node->rule.flags= defined ? RuleUsed : 0;
  node->rule.next= rules;
  rules= node;
  return node;
}